

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printSORegRegOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  ARM_AM_ShiftOpc Op;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  int64_t iVar5;
  char *s;
  ARM_AM_ShiftOpc ShOpc;
  MCOperand *MO3;
  MCOperand *MO2;
  MCOperand *MO1;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  op_01 = MCInst_getOperand(MI,OpNum + 2);
  pcVar2 = MI->csh;
  uVar4 = MCOperand_getReg(op);
  printRegName(pcVar2,O,uVar4);
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar1 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(op);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
    iVar5 = MCOperand_getImm(op_01);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x3a) =
         ((uint)iVar5 & 7) + 5;
    pcVar3 = MI->flat_insn->detail;
    (pcVar3->field_6).arm.op_count = (pcVar3->field_6).arm.op_count + '\x01';
  }
  iVar5 = MCOperand_getImm(op_01);
  Op = ARM_AM_getSORegShOp((uint)iVar5);
  SStream_concat0(O,", ");
  s = ARM_AM_getShiftOpcStr(Op);
  SStream_concat0(O,s);
  if (Op != ARM_AM_rrx) {
    SStream_concat0(O," ");
    pcVar2 = MI->csh;
    uVar4 = MCOperand_getReg(op_00);
    printRegName(pcVar2,O,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar4 = MCOperand_getReg(op_00);
      *(uint *)(MI->flat_insn->detail->groups +
               (long)(int)((MI->flat_insn->detail->field_6).arm.op_count - 1) * 0x28 + 0x3e) = uVar4
      ;
    }
  }
  return;
}

Assistant:

static void printSORegRegOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	MCOperand *MO3 = MCInst_getOperand(MI, OpNum+2);
	ARM_AM_ShiftOpc ShOpc;

	printRegName(MI->csh, O, MCOperand_getReg(MO1));

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);

		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.type = (MCOperand_getImm(MO3) & 7) + ARM_SFT_ASR_REG - 1;
		MI->flat_insn->detail->arm.op_count++;
	}

	// Print the shift opc.
	ShOpc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3));
	SStream_concat0(O, ", ");
	SStream_concat0(O, ARM_AM_getShiftOpcStr(ShOpc));
	if (ShOpc == ARM_AM_rrx)
		return;

	SStream_concat0(O, " ");
	printRegName(MI->csh, O, MCOperand_getReg(MO2));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = MCOperand_getReg(MO2);
	//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
}